

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MiddleVal.cpp
# Opt level: O0

MiddleVal * __thiscall MiddleVal::operator-=(MiddleVal *this,MiddleVal *t)

{
  bool bVar1;
  double local_30;
  double b;
  double a;
  double result;
  MiddleVal *t_local;
  MiddleVal *this_local;
  
  bVar1 = std::operator==(&this->Type,"real");
  if (bVar1) {
    b = this->dVal;
  }
  else {
    b = (double)this->iVal;
  }
  bVar1 = std::operator==(&t->Type,"real");
  if (bVar1) {
    local_30 = t->dVal;
  }
  else {
    local_30 = (double)t->iVal;
  }
  bVar1 = std::operator==(&this->Type,"real");
  if ((!bVar1) && (bVar1 = std::operator==(&t->Type,"real"), !bVar1)) {
    this->iVal = (int)(b * local_30);
    return this;
  }
  std::__cxx11::string::operator=((string *)this,"real");
  this->dVal = b * local_30;
  return this;
}

Assistant:

MiddleVal &MiddleVal::operator-=(MiddleVal t) {
    double result, a, b;
    if (Type == "real") {
        a = dVal;
    } else {
        a = iVal;
    }
    if (t.Type == "real") {
        b = t.dVal;
    } else {
        b = t.iVal;
    }
    result = a * b;
    if (Type == "real" || t.Type == "real") {
        Type = "real";
        dVal = result;
    } else {
        iVal = (int) result;
    }
    return *this;
}